

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::ByteCodeWriter::TryWriteCallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (ByteCodeWriter *this,OpCode op,RegSlot returnValueRegister,RegSlot functionRegister,
          ArgSlot givenArgCount,InlineCacheIndex inlineCacheIndex,bool isRootLoad,
          CallFlags callFlags)

{
  code *pcVar1;
  size_t sVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  undefined4 *puVar6;
  ArenaAllocator *allocator;
  unsigned_long local_48;
  size_t inlineCacheOffset;
  size_t offset;
  OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  bool isRootLoad_local;
  InlineCacheIndex inlineCacheIndex_local;
  ArgSlot givenArgCount_local;
  RegSlot functionRegister_local;
  RegSlot returnValueRegister_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  layout.super_OpLayoutT_CallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>.inlineCacheIndex
  ._0_1_ = isRootLoad;
  layout._4_4_ = inlineCacheIndex;
  unique0x100001fc = givenArgCount;
  bVar3 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<char,unsigned_int>
                    ((char *)((long)&offset + 1),returnValueRegister);
  if ((((bVar3) &&
       (bVar3 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_int>
                          ((uchar *)((long)&offset + 2),functionRegister), bVar3)) &&
      (bVar3 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_short>
                         ((uchar *)&offset,stack0xffffffffffffffda), bVar3)) &&
     ((bVar3 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_int,unsigned_int>
                         ((uint *)((long)&offset + 3),layout._4_4_), bVar3 &&
      (bVar3 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<Js::CallFlags,Js::CallFlags>
                         ((CallFlags *)((long)&offset + 7),callFlags), bVar3)))) {
    uVar4 = Data::EncodeT<(Js::LayoutSize)0>(&this->m_byteCodeData,op,&offset,0xb,this);
    inlineCacheOffset = (size_t)uVar4;
    if (((byte)layout.super_OpLayoutT_CallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>.
               inlineCacheIndex & 1) != 0) {
      uVar4 = Data::GetCurrentOffset(&this->m_byteCodeData);
      sVar2 = inlineCacheOffset;
      uVar5 = OpCodeUtil::EncodedSize(op,SmallLayout);
      if ((ulong)uVar4 != sVar2 + uVar5 + 0xb) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x4a7,
                                    "(m_byteCodeData.GetCurrentOffset() == offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum) + sizeof(OpLayoutT_CallIFlagsWithICIndex<SizePolicy>))"
                                    ,
                                    "m_byteCodeData.GetCurrentOffset() == offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum) + sizeof(OpLayoutT_CallIFlagsWithICIndex<SizePolicy>)"
                                   );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      sVar2 = inlineCacheOffset;
      uVar4 = OpCodeUtil::EncodedSize(op,SmallLayout);
      local_48 = sVar2 + uVar4 + 3;
      allocator = JsUtil::
                  List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::GetAllocator(this->m_labelOffsets);
      SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount>::Prepend
                (&this->rootObjectLoadMethodInlineCacheOffsets,allocator,&local_48);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ByteCodeWriter::TryWriteCallIFlagsWithICIndex(OpCode op, RegSlot returnValueRegister, RegSlot functionRegister, ArgSlot givenArgCount, InlineCacheIndex inlineCacheIndex, bool isRootLoad, CallFlags callFlags)
    {
        OpLayoutT_CallIFlagsWithICIndex<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Return, returnValueRegister) && SizePolicy::Assign(layout.Function, functionRegister)
            && SizePolicy::Assign(layout.ArgCount, givenArgCount) && SizePolicy::Assign(layout.inlineCacheIndex, inlineCacheIndex)
            && SizePolicy::Assign(layout.callFlags, callFlags))
        {
            size_t offset = m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);

            if (isRootLoad)
            {
                Assert(m_byteCodeData.GetCurrentOffset() == offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum) + sizeof(OpLayoutT_CallIFlagsWithICIndex<SizePolicy>));
                size_t inlineCacheOffset = offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum)
                    + offsetof(OpLayoutT_CallIFlagsWithICIndex<SizePolicy>, inlineCacheIndex);

                rootObjectLoadMethodInlineCacheOffsets.Prepend(m_labelOffsets->GetAllocator(), inlineCacheOffset);
            }
            return true;
        }
        return false;
    }